

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.c
# Opt level: O3

int check_posture(CHAR_DATA *ch)

{
  AFFECT_DATA *pAVar1;
  
  pAVar1 = (AFFECT_DATA *)&ch->affected;
  do {
    pAVar1 = pAVar1->next;
    if (pAVar1 == (AFFECT_DATA *)0x0) {
      return 0;
    }
  } while (pAVar1->type != gsn_posture);
  return (int)pAVar1->modifier;
}

Assistant:

int check_posture(CHAR_DATA *ch)
{
	AFFECT_DATA *paf;
	int modifier = POSTURE_NONE;

	for (paf = ch->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->type == gsn_posture)
		{
			modifier = paf->modifier;
			break;
		}
	}

	return modifier;
}